

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapCPPCommand.cxx
# Opt level: O0

bool __thiscall
cmQTWrapCPPCommand::InitialPass
          (cmQTWrapCPPCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer *this_00;
  cmMakefile *pcVar1;
  cmSourceFile *this_01;
  undefined8 name;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  reference pbVar5;
  cmSourceFile *pcVar6;
  ulong uVar7;
  bool local_38a;
  bool local_329;
  char *no_working_dir;
  undefined1 local_2d0 [8];
  string no_main_dependency;
  value_type local_2a8;
  undefined1 local_288 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  value_type local_250;
  allocator local_229;
  value_type local_228;
  undefined1 local_208 [8];
  cmCustomCommandLine commandLine;
  string local_1e8;
  undefined1 local_1c8 [8];
  string hname;
  string local_1a0;
  allocator local_179;
  string local_178;
  cmSourceFile *local_158;
  cmSourceFile *sf;
  undefined1 local_148 [8];
  string newName;
  string srcName;
  string local_100;
  cmSourceFile *local_e0;
  cmSourceFile *curr;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  const_iterator j;
  string local_b8 [8];
  string sourceListValue;
  string *sourceList;
  string local_88;
  char *local_68;
  char *moc_exe;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmQTWrapCPPCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_88,"QT_MOC_EXECUTABLE",(allocator *)((long)&sourceList + 7));
    pcVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sourceList + 7));
    local_68 = pcVar4;
    sourceListValue.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local,1);
    pcVar4 = cmMakefile::GetSafeDefinition
                       ((this->super_cmCommand).Makefile,(string *)sourceListValue.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,pcVar4,(allocator *)((long)&j._M_current + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&j._M_current + 7));
    local_d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
    local_c8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator+(&local_d0,2);
    while( true ) {
      curr = (cmSourceFile *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
      bVar2 = __gnu_cxx::operator!=
                        (&local_c8,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&curr);
      name = sourceListValue.field_2._8_8_;
      if (!bVar2) break;
      pcVar1 = (this->super_cmCommand).Makefile;
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_c8);
      pcVar6 = cmMakefile::GetSource(pcVar1,pbVar5);
      srcName.field_2._M_local_buf[0xe] = '\0';
      srcName.field_2._M_local_buf[0xd] = '\0';
      local_329 = false;
      local_e0 = pcVar6;
      if (pcVar6 != (cmSourceFile *)0x0) {
        std::allocator<char>::allocator();
        srcName.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string
                  ((string *)&local_100,"WRAP_EXCLUDE",
                   (allocator *)(srcName.field_2._M_local_buf + 0xf));
        srcName.field_2._M_local_buf[0xd] = '\x01';
        local_329 = cmSourceFile::GetPropertyAsBool(pcVar6,&local_100);
      }
      if ((srcName.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_100);
      }
      if ((srcName.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(srcName.field_2._M_local_buf + 0xf));
      }
      if (((local_329 ^ 0xffU) & 1) != 0) {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_c8);
        cmsys::SystemTools::GetFilenameWithoutLastExtension
                  ((string *)((long)&newName.field_2 + 8),pbVar5);
        pcVar4 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_148,pcVar4,(allocator *)((long)&sf + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&sf + 7));
        std::__cxx11::string::operator+=((string *)local_148,"/moc_");
        std::__cxx11::string::operator+=
                  ((string *)local_148,(string *)(newName.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_148,".cxx");
        pcVar6 = cmMakefile::GetOrCreateSource
                           ((this->super_cmCommand).Makefile,(string *)local_148,true);
        local_158 = pcVar6;
        if (local_e0 != (cmSourceFile *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_178,"ABSTRACT",&local_179);
          this_01 = local_e0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1a0,"ABSTRACT",(allocator *)(hname.field_2._M_local_buf + 0xf)
                    );
          pcVar4 = cmSourceFile::GetProperty(this_01,&local_1a0);
          cmSourceFile::SetProperty(pcVar6,&local_178,pcVar4);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::allocator<char>::~allocator((allocator<char> *)(hname.field_2._M_local_buf + 0xf));
          std::__cxx11::string::~string((string *)&local_178);
          std::allocator<char>::~allocator((allocator<char> *)&local_179);
        }
        std::__cxx11::string::string((string *)local_1c8);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_c8);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar4);
        pcVar6 = local_e0;
        if (bVar2) {
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_c8);
          std::__cxx11::string::operator=((string *)local_1c8,(string *)pbVar5);
        }
        else {
          commandLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
          commandLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
          local_38a = false;
          if (local_e0 != (cmSourceFile *)0x0) {
            std::allocator<char>::allocator();
            commandLine.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
            std::__cxx11::string::string
                      ((string *)&local_1e8,"GENERATED",
                       (allocator *)
                       ((long)&commandLine.
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            commandLine.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
            local_38a = cmSourceFile::GetPropertyAsBool(pcVar6,&local_1e8);
          }
          if ((commandLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_1e8);
          }
          if ((commandLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&commandLine.
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          }
          if (local_38a == false) {
            pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
            std::__cxx11::string::operator=((string *)local_1c8,pcVar4);
          }
          else {
            pcVar4 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
            std::__cxx11::string::operator=((string *)local_1c8,pcVar4);
          }
          std::__cxx11::string::operator+=((string *)local_1c8,"/");
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_c8);
          std::__cxx11::string::operator+=((string *)local_1c8,(string *)pbVar5);
        }
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::__cxx11::string::operator+=(local_b8,";");
        }
        std::__cxx11::string::operator+=(local_b8,(string *)local_148);
        cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_208);
        pcVar4 = local_68;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_228,pcVar4,&local_229);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_208,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator((allocator<char> *)&local_229);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_250,"-o",
                   (allocator *)
                   ((long)&commandLines.
                           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_208,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&commandLines.
                           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_208,(value_type *)local_148);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_208,(value_type *)local_1c8);
        this_00 = &depends.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        cmCustomCommandLines::cmCustomCommandLines((cmCustomCommandLines *)this_00);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)this_00,
                   (value_type *)local_208);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_288);
        pcVar4 = local_68;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2a8,pcVar4,
                   (allocator *)(no_main_dependency.field_2._M_local_buf + 0xf));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_288,&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(no_main_dependency.field_2._M_local_buf + 0xf));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_288,(value_type *)local_1c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_2d0,"",(allocator *)((long)&no_working_dir + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&no_working_dir + 7));
        cmMakefile::AddCustomCommandToOutput
                  ((this->super_cmCommand).Makefile,(string *)local_148,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_288,(string *)local_2d0,
                   (cmCustomCommandLines *)
                   &depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"Qt Wrapped File",(char *)0x0
                   ,false,true,false);
        std::__cxx11::string::~string((string *)local_2d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_288);
        cmCustomCommandLines::~cmCustomCommandLines
                  ((cmCustomCommandLines *)
                   &depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_208);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::string::~string((string *)local_148);
        std::__cxx11::string::~string((string *)(newName.field_2._M_local_buf + 8));
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_c8);
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,(string *)name,pcVar4);
    this_local._7_1_ = 1;
    std::__cxx11::string::~string(local_b8);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQTWrapCPPCommand::InitialPass(std::vector<std::string> const& args,
                                     cmExecutionStatus &)
{
  if(args.size() < 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // Get the moc executable to run in the custom command.
  const char* moc_exe =
    this->Makefile->GetRequiredDefinition("QT_MOC_EXECUTABLE");

  // Get the variable holding the list of sources.
  std::string const& sourceList = args[1];
  std::string sourceListValue =
    this->Makefile->GetSafeDefinition(sourceList);

  // Create a rule for all sources listed.
  for(std::vector<std::string>::const_iterator j = (args.begin() + 2);
      j != args.end(); ++j)
    {
    cmSourceFile *curr = this->Makefile->GetSource(*j);
    // if we should wrap the class
    if(!(curr && curr->GetPropertyAsBool("WRAP_EXCLUDE")))
      {
      // Compute the name of the file to generate.
      std::string srcName =
        cmSystemTools::GetFilenameWithoutLastExtension(*j);
      std::string newName = this->Makefile->GetCurrentBinaryDirectory();
      newName += "/moc_";
      newName += srcName;
      newName += ".cxx";
      cmSourceFile* sf =
        this->Makefile->GetOrCreateSource(newName, true);
      if (curr)
        {
        sf->SetProperty("ABSTRACT", curr->GetProperty("ABSTRACT"));
        }

      // Compute the name of the header from which to generate the file.
      std::string hname;
      if(cmSystemTools::FileIsFullPath(j->c_str()))
        {
        hname = *j;
        }
      else
        {
        if(curr && curr->GetPropertyAsBool("GENERATED"))
          {
          hname = this->Makefile->GetCurrentBinaryDirectory();
          }
        else
          {
          hname = this->Makefile->GetCurrentSourceDirectory();
          }
        hname += "/";
        hname += *j;
        }

      // Append the generated source file to the list.
      if(!sourceListValue.empty())
        {
        sourceListValue += ";";
        }
      sourceListValue += newName;

      // Create the custom command to generate the file.
      cmCustomCommandLine commandLine;
      commandLine.push_back(moc_exe);
      commandLine.push_back("-o");
      commandLine.push_back(newName);
      commandLine.push_back(hname);

      cmCustomCommandLines commandLines;
      commandLines.push_back(commandLine);

      std::vector<std::string> depends;
      depends.push_back(moc_exe);
      depends.push_back(hname);

      std::string no_main_dependency = "";
      const char* no_working_dir = 0;
      this->Makefile->AddCustomCommandToOutput(newName,
                                               depends,
                                               no_main_dependency,
                                               commandLines,
                                               "Qt Wrapped File",
                                               no_working_dir);
      }
    }

  // Store the final list of source files.
  this->Makefile->AddDefinition(sourceList,
                                sourceListValue.c_str());
  return true;
}